

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-otpc.cpp
# Opt level: O2

void __thiscall server::server(server *this,io_service *io_service,int port)

{
  type pcVar1;
  undefined8 local_38;
  uchar local_30;
  uchar uStack_2f;
  uchar uStack_2e;
  uchar uStack_2d;
  uchar uStack_2c;
  uchar uStack_2b;
  uchar uStack_2a;
  uchar uStack_29;
  undefined8 uStack_28;
  undefined4 local_20;
  
  this->io_service_ = io_service;
  local_20 = 0;
  local_30 = '\0';
  uStack_2f = '\0';
  uStack_2e = '\0';
  uStack_2d = '\0';
  uStack_2c = '\0';
  uStack_2b = '\0';
  uStack_2a = '\0';
  uStack_29 = '\0';
  uStack_28 = 0;
  local_38._2_2_ = (ushort)port << 8 | (ushort)port >> 8;
  local_38._0_2_ = 2;
  local_38._4_4_ = 0;
  boost::asio::
  basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_socket_acceptor<boost::asio::io_context>
            (&this->acceptor_,io_service,(endpoint_type *)&local_38,true,(type *)0x0);
  connection::create((connection *)&this->new_connection_,this->io_service_);
  pcVar1 = boost::shared_ptr<connection>::operator->(&this->new_connection_);
  local_38 = handle_accept;
  local_30 = '\0';
  uStack_2f = '\0';
  uStack_2e = '\0';
  uStack_2d = '\0';
  uStack_2c = '\0';
  uStack_2b = '\0';
  uStack_2a = '\0';
  uStack_29 = '\0';
  uStack_28 = this;
  boost::asio::
  basic_socket_acceptor<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::
  async_accept<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::_bi::bind_t<void,boost::_mfi::mf1<void,server,boost::system::error_code_const&>,boost::_bi::list2<boost::_bi::value<server*>,boost::arg<1>(*)()>>>
            ((basic_socket_acceptor<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)&this->acceptor_,
             &(pcVar1->socket_).
              super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             ,(bind_t<void,_boost::_mfi::mf1<void,_server,_const_boost::system::error_code_&>,_boost::_bi::list2<boost::_bi::value<server_*>,_boost::arg<1>_(*)()>_>
               *)&local_38,(type *)0x0);
  return;
}

Assistant:

server::server(ba::io_service& io_service,int port)
	: io_service_(io_service),
	  acceptor_(io_service_, ba::ip::tcp::endpoint(ba::ip::tcp::v4(), port)),
	  new_connection_(connection::create(io_service_)) {
	// start acceptor in async mode
	acceptor_.async_accept(new_connection_->socket(),
						   boost::bind(&server::handle_accept, this,
									   ba::placeholders::error));
}